

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O1

void Io_WriteBookLogic(Abc_Ntk_t *pNtk,char *FileName)

{
  Abc_Ntk_t *pNtk_00;
  
  pNtk_00 = Abc_NtkToNetlist(pNtk);
  if (pNtk_00 != (Abc_Ntk_t *)0x0) {
    Io_WriteBook(pNtk_00,FileName);
    Abc_NtkDelete(pNtk_00);
    return;
  }
  fwrite("Writing BOOK has failed.\n",0x19,1,_stdout);
  return;
}

Assistant:

void Io_WriteBookLogic( Abc_Ntk_t * pNtk, char * FileName )
{
    Abc_Ntk_t * pNtkTemp;
    // derive the netlist
    pNtkTemp = Abc_NtkToNetlist(pNtk);
    if ( pNtkTemp == NULL )
    {
        fprintf( stdout, "Writing BOOK has failed.\n" );
        return;
    }
    Io_WriteBook( pNtkTemp, FileName );
    Abc_NtkDelete( pNtkTemp );
}